

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharTrie.cpp
# Opt level: O1

void __thiscall UnifiedRegex::CharTrie::Print(CharTrie *this,DebugWriter *w)

{
  long lVar1;
  long lVar2;
  
  DebugWriter::Indent(w);
  if (this->isAccepting == true) {
    DebugWriter::PrintEOL(w,L"<accept>");
  }
  if (0 < this->count) {
    lVar2 = 8;
    lVar1 = 0;
    do {
      DebugWriter::PrintQuotedChar(w,*(Char *)((long)this->children + lVar2 + -8));
      DebugWriter::EOL(w);
      Print((CharTrie *)((long)&this->children->c + lVar2),w);
      lVar1 = lVar1 + 1;
      lVar2 = lVar2 + 0x20;
    } while (lVar1 < this->count);
  }
  DebugWriter::Unindent(w);
  return;
}

Assistant:

void CharTrie::Print(DebugWriter* w) const
    {
        w->Indent();
        if (isAccepting)
            w->PrintEOL(_u("<accept>"));
        for (int i = 0; i < count; i++)
        {
            w->PrintQuotedChar(children[i].c);
            w->EOL();
            children[i].node.Print(w);
        }
        w->Unindent();
    }